

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutomationBasic.cpp
# Opt level: O3

void __thiscall AutomationBasic::reread(AutomationBasic *this)

{
  _Rb_tree_node_base *__args;
  PolledFile *pPVar1;
  pointer puVar2;
  Value *pVVar3;
  bool bVar4;
  byte bVar5;
  undefined8 uVar6;
  int iVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  _Rb_tree_node_base *p_Var9;
  char *in_RCX;
  int iVar10;
  nfds_t in_RDX;
  ulong uVar11;
  uint uVar12;
  Value *this_00;
  string_view s;
  ExpectedRef<const_std::string,_std::string> float_string;
  Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parsed_float;
  Keypoint kp;
  ExpectedRef<const_Sequence,_std::string> row;
  ExpectedRef<const_Sequence,_std::string> sequence;
  Data new_data;
  ExpectedRef<const_Mapping,_std::string> map;
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parsed;
  undefined1 local_1e8 [32];
  char local_1c8;
  undefined1 local_1c0 [32];
  byte local_1a0;
  undefined1 local_198 [8];
  undefined1 auStack_190 [8];
  float local_188;
  undefined1 local_180 [32];
  char local_160;
  undefined1 local_158 [8];
  Keypoint *local_150;
  iterator iStack_148;
  Keypoint *local_140;
  undefined1 local_138 [32];
  char local_118;
  AutomationBasic *local_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
  local_108;
  _Rb_tree_node_base *local_d8;
  undefined1 local_d0 [32];
  char local_b0;
  anon_union_112_2_9b3c4038_for_Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_a8;
  char local_38;
  
  pPVar1 = (this->source_)._M_t.super___uniq_ptr_impl<PolledFile,_std::default_delete<PolledFile>_>.
           _M_t.super__Tuple_impl<0UL,_PolledFile_*,_std::default_delete<PolledFile>_>.
           super__Head_base<0UL,_PolledFile_*,_false>._M_head_impl;
  uVar12 = this->seq_ + 1;
  this->seq_ = uVar12;
  iVar7 = PolledFile::poll(pPVar1,(pollfd *)(ulong)uVar12,in_RDX,(int)in_RCX);
  if ((char)iVar7 != '\0') {
    pPVar1 = (this->source_)._M_t.
             super___uniq_ptr_impl<PolledFile,_std::default_delete<PolledFile>_>._M_t.
             super__Tuple_impl<0UL,_PolledFile_*,_std::default_delete<PolledFile>_>.
             super__Head_base<0UL,_PolledFile_*,_false>._M_head_impl;
    local_110 = this;
    pvVar8 = PolledFile::data(pPVar1);
    puVar2 = (pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar8 = PolledFile::data(pPVar1);
    s._M_str = in_RCX;
    s._M_len = (size_t)puVar2;
    yaml::parse_abi_cxx11_
              ((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a8.value_,
               (yaml *)((pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish +
                       -(long)(pvVar8->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start),s);
    if (local_38 == '\0') {
      aAppDebugPrintf("Automation parsing failed: %s",local_a8.error_.error_._M_dataplus._M_p);
    }
    else {
      yaml::Value::getMapping_abi_cxx11_
                ((ExpectedRef<const_Mapping,_std::string> *)
                 &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                    *)local_d0)->value_,&local_a8.value_);
      if (local_b0 == '\0') {
        aAppDebugPrintf("Automation must start with mapping: %s",local_d0._0_8_);
      }
      else {
        local_108._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_108._M_impl.super__Rb_tree_header._M_header;
        local_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_108._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var9 = *(_Base_ptr *)(local_d0._0_8_ + 0x18);
        local_d8 = (_Rb_tree_node_base *)(local_d0._0_8_ + 8);
        local_108._M_impl.super__Rb_tree_header._M_header._M_right =
             local_108._M_impl.super__Rb_tree_header._M_header._M_left;
        if (p_Var9 != local_d8) {
          do {
            yaml::Value::getSequence_abi_cxx11_
                      ((ExpectedRef<const_Sequence,_std::string> *)
                       &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                          *)local_138)->value_,(Value *)(p_Var9 + 2));
            __args = p_Var9 + 1;
            if (local_118 == '\0') {
              aAppDebugPrintf("Error parsing %s: %s",*(undefined8 *)__args,local_138._0_8_);
              if ((local_118 == '\0') &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                *)local_138)->error_).error_ + 0x10U))) {
                operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
              }
              goto LAB_0010be05;
            }
            local_158._0_4_ = 0;
            local_150 = (Keypoint *)0x0;
            iStack_148._M_current = (Keypoint *)0x0;
            local_140 = (Keypoint *)0x0;
            this_00 = *(Value **)local_138._0_8_;
            pVVar3 = *(pointer *)(local_138._0_8_ + 8);
            if (this_00 == pVVar3) {
              bVar4 = true;
            }
            else {
              do {
                yaml::Value::getSequence_abi_cxx11_
                          ((ExpectedRef<const_Sequence,_std::string> *)
                           &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                              *)local_180)->value_,this_00);
                uVar6 = local_180._0_8_;
                if (local_160 == '\0') {
                  aAppDebugPrintf("Error parsing %s row: %s",*(undefined8 *)__args,local_180._0_8_);
LAB_0010bc6f:
                  if ((local_160 == '\0') &&
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_180._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                    *)local_180)->error_).error_ + 0x10U))) {
                    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
                  }
                  bVar4 = false;
                  goto LAB_0010bc9f;
                }
                uVar11 = ((long)*(pointer *)(local_180._0_8_ + 8) - *(long *)local_180._0_8_ >> 4) *
                         0x6db6db6db6db6db7;
                if (uVar11 < 2) {
                  aAppDebugPrintf("Error parsing %s row: should be at least [t, x]",
                                  *(undefined8 *)__args);
                  goto LAB_0010bc6f;
                }
                if (5 < uVar11) {
                  aAppDebugPrintf("Error parsing %s row: too many components %d, max 4",
                                  *(undefined8 *)__args);
                  goto LAB_0010bc6f;
                }
                iVar10 = (int)uVar11 + -1;
                iVar7 = iVar10;
                if ((local_158._0_4_ != 0) && (iVar7 = local_158._0_4_, local_158._0_4_ != iVar10))
                {
                  aAppDebugPrintf("Error parsing %s row: inconsistent number of components %d, %d expected"
                                  ,*(undefined8 *)__args);
                  goto LAB_0010bc6f;
                }
                local_158._0_4_ = iVar7;
                local_198._0_4_ = 0.0;
                local_198._4_4_ = 0.0;
                auStack_190._0_4_ = 0.0;
                auStack_190._4_4_ = 0.0;
                local_188 = 0.0;
                yaml::Value::getString_abi_cxx11_
                          ((ExpectedRef<const_std::string,_std::string> *)
                           &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                              *)local_1e8)->value_,*(Value **)local_180._0_8_);
                if (local_1c8 == '\0') {
                  aAppDebugPrintf("Error parsing %s row time: %s",*(undefined8 *)__args,
                                  local_1e8._0_8_);
LAB_0010bc4d:
                  if ((local_1c8 == '\0') &&
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                    *)local_1e8)->error_).error_ + 0x10U))) {
                    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
                  }
                  goto LAB_0010bc6f;
                }
                floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                      *)local_1c0)->error_,(string *)local_1e8._0_8_);
                bVar5 = local_1a0;
                if (local_1a0 == 0) {
                  aAppDebugPrintf("Error parsing %s row time: %s",*(undefined8 *)__args,
                                  CONCAT44(local_1c0._4_4_,local_1c0._0_4_));
                }
                else {
                  local_198._0_4_ = local_1c0._0_4_;
                }
                if (((local_1a0 & 1) == 0) &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_) !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_1c0)->error_).error_ + 0x10U))) {
                  operator_delete((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),
                                  local_1c0._16_8_ + 1);
                }
                if ((local_1c8 == '\0') &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_1e8)->error_).error_ + 0x10U))) {
                  operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
                }
                if (bVar5 == 0) goto LAB_0010bc6f;
                yaml::Value::getString_abi_cxx11_
                          ((ExpectedRef<const_std::string,_std::string> *)
                           &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                              *)local_1e8)->value_,(Value *)(*(long *)uVar6 + 0x70));
                if (local_1c8 == '\0') {
                  aAppDebugPrintf("Error parsing %s row x: %s",*(undefined8 *)__args,local_1e8._0_8_
                                 );
                  goto LAB_0010bc4d;
                }
                floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                      *)local_1c0)->error_,(string *)local_1e8._0_8_);
                bVar5 = local_1a0;
                if (local_1a0 == 0) {
                  aAppDebugPrintf("Error parsing %s row x: %s",*(undefined8 *)__args,
                                  CONCAT44(local_1c0._4_4_,local_1c0._0_4_));
                }
                else {
                  local_198._4_4_ = local_1c0._0_4_;
                }
                if (((local_1a0 & 1) == 0) &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_) !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_1c0)->error_).error_ + 0x10U))) {
                  operator_delete((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),
                                  local_1c0._16_8_ + 1);
                }
                if ((local_1c8 == '\0') &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_1e8)->error_).error_ + 0x10U))) {
                  operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
                }
                if (bVar5 == 0) goto LAB_0010bc6f;
                if (2 < (ulong)(((long)*(pointer *)(uVar6 + 8) - *(long *)uVar6 >> 4) *
                               0x6db6db6db6db6db7)) {
                  yaml::Value::getString_abi_cxx11_
                            ((ExpectedRef<const_std::string,_std::string> *)
                             &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                *)local_1e8)->value_,(Value *)(*(long *)uVar6 + 0xe0));
                  if (local_1c8 == '\0') {
                    aAppDebugPrintf("Error parsing %s row y: %s",*(undefined8 *)__args,
                                    local_1e8._0_8_);
                    goto LAB_0010bc4d;
                  }
                  floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                        *)local_1c0)->error_,(string *)local_1e8._0_8_);
                  bVar5 = local_1a0;
                  if (local_1a0 == 0) {
                    aAppDebugPrintf("Error parsing %s row y: %s",*(undefined8 *)__args,
                                    CONCAT44(local_1c0._4_4_,local_1c0._0_4_));
                  }
                  else {
                    auStack_190._0_4_ = local_1c0._0_4_;
                  }
                  if (((local_1a0 & 1) == 0) &&
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_) !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                    *)local_1c0)->error_).error_ + 0x10U))) {
                    operator_delete((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),
                                    local_1c0._16_8_ + 1);
                  }
                  if ((local_1c8 == '\0') &&
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                    *)local_1e8)->error_).error_ + 0x10U))) {
                    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
                  }
                  if (bVar5 == 0) goto LAB_0010bc6f;
                  if (3 < (ulong)(((long)*(pointer *)(uVar6 + 8) - *(long *)uVar6 >> 4) *
                                 0x6db6db6db6db6db7)) {
                    yaml::Value::getString_abi_cxx11_
                              ((ExpectedRef<const_std::string,_std::string> *)
                               &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_1e8)->value_,(Value *)(*(long *)uVar6 + 0x150));
                    if (local_1c8 == '\0') {
                      aAppDebugPrintf("Error parsing %s row z: %s",*(undefined8 *)__args,
                                      local_1e8._0_8_);
                      goto LAB_0010bc4d;
                    }
                    floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                          *)local_1c0)->error_,(string *)local_1e8._0_8_);
                    bVar5 = local_1a0;
                    if (local_1a0 == 0) {
                      aAppDebugPrintf("Error parsing %s row z: %s",*(undefined8 *)__args,
                                      CONCAT44(local_1c0._4_4_,local_1c0._0_4_));
                    }
                    else {
                      auStack_190._4_4_ = local_1c0._0_4_;
                    }
                    if (((local_1a0 & 1) == 0) &&
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_) !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                      *)local_1c0)->error_).error_ + 0x10U))) {
                      operator_delete((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),
                                      local_1c0._16_8_ + 1);
                    }
                    if ((local_1c8 == '\0') &&
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e8._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                      *)local_1e8)->error_).error_ + 0x10U))) {
                      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
                    }
                    if (bVar5 == 0) goto LAB_0010bc6f;
                    if (4 < (ulong)(((long)*(pointer *)(uVar6 + 8) - *(long *)uVar6 >> 4) *
                                   0x6db6db6db6db6db7)) {
                      yaml::Value::getString_abi_cxx11_
                                ((ExpectedRef<const_std::string,_std::string> *)
                                 &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                    *)local_1e8)->value_,(Value *)(*(long *)uVar6 + 0x1c0));
                      if (local_1c8 == '\0') {
                        aAppDebugPrintf("Error parsing %s row w: %s",*(undefined8 *)__args,
                                        local_1e8._0_8_);
                        goto LAB_0010bc4d;
                      }
                      floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                            *)local_1c0)->error_,(string *)local_1e8._0_8_);
                      bVar5 = local_1a0;
                      if (local_1a0 == 0) {
                        aAppDebugPrintf("Error parsing %s row w: %s",*(undefined8 *)__args,
                                        CONCAT44(local_1c0._4_4_,local_1c0._0_4_));
                      }
                      else {
                        local_188 = (float)local_1c0._0_4_;
                      }
                      if (((local_1a0 & 1) == 0) &&
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_) !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                        *)local_1c0)->error_).error_ + 0x10U))) {
                        operator_delete((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),
                                        local_1c0._16_8_ + 1);
                      }
                      if ((local_1c8 == '\0') &&
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e8._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                        *)local_1e8)->error_).error_ + 0x10U))) {
                        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
                      }
                      if (bVar5 == 0) goto LAB_0010bc6f;
                    }
                  }
                }
                if ((local_150 != iStack_148._M_current) &&
                   ((float)local_198._0_4_ < iStack_148._M_current[-1].row)) {
                  aAppDebugPrintf("Error parsing %s rows: monotonic time expected",
                                  *(undefined8 *)__args);
                  goto LAB_0010bc6f;
                }
                if (iStack_148._M_current == local_140) {
                  std::vector<AutomationBasic::Keypoint,std::allocator<AutomationBasic::Keypoint>>::
                  _M_realloc_insert<AutomationBasic::Keypoint_const&>
                            ((vector<AutomationBasic::Keypoint,std::allocator<AutomationBasic::Keypoint>>
                              *)&local_150,iStack_148,(Keypoint *)local_198);
                }
                else {
                  ((iStack_148._M_current)->value).w = local_188;
                  (iStack_148._M_current)->row = (float)local_198._0_4_;
                  ((iStack_148._M_current)->value).x = (float)local_198._4_4_;
                  ((iStack_148._M_current)->value).y = (float)auStack_190._0_4_;
                  ((iStack_148._M_current)->value).z = (float)auStack_190._4_4_;
                  iStack_148._M_current = iStack_148._M_current + 1;
                }
                if ((local_160 == '\0') &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                                  *)local_180)->error_).error_ + 0x10U))) {
                  operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
                }
                this_00 = this_00 + 1;
              } while (this_00 != pVVar3);
              if (local_150 == iStack_148._M_current) {
                bVar4 = true;
              }
              else {
                bVar4 = true;
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,AutomationBasic::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>>
                ::_M_emplace_unique<std::__cxx11::string_const,AutomationBasic::Variable>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,AutomationBasic::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>>
                            *)&local_108,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __args,(Variable *)local_158);
              }
LAB_0010bc9f:
              if (local_150 != (Keypoint *)0x0) {
                operator_delete(local_150,(long)local_140 - (long)local_150);
              }
            }
            if ((local_118 == '\0') &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                              *)local_138)->error_).error_ + 0x10U))) {
              operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
            }
            if (!bVar4) goto LAB_0010be05;
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != local_d8);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
        ::clear(&(local_110->data_)._M_t);
        if (local_108._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          (local_110->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_108._M_impl.super__Rb_tree_header._M_header._M_color;
          (local_110->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_108._M_impl.super__Rb_tree_header._M_header._M_parent;
          (local_110->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_108._M_impl.super__Rb_tree_header._M_header._M_left;
          (local_110->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_108._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_108._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &(local_110->data_)._M_t._M_impl.super__Rb_tree_header._M_header;
          (local_110->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_108._M_impl.super__Rb_tree_header._M_node_count;
          local_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_108._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_108._M_impl.super__Rb_tree_header._M_header;
          local_108._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_108._M_impl.super__Rb_tree_header._M_header._M_right =
               local_108._M_impl.super__Rb_tree_header._M_header._M_left;
        }
LAB_0010be05:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
        ::~_Rb_tree(&local_108);
      }
      if ((local_b0 == '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                        *)local_d0)->error_).error_ + 0x10U))) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
    }
    Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a8.value_);
  }
  return;
}

Assistant:

void AutomationBasic::reread() {
	if (!source_->poll(++seq_))
		return;

	auto parsed = yaml::parse(source_->string());
	if (!parsed) {
		MSG("Automation parsing failed: %s", parsed.error().c_str());
		return;
	}
	auto map = parsed->getMapping();
	if (!map) {
		MSG("Automation must start with mapping: %s", map.error().c_str());
		return;
	}

	Data new_data;

	const yaml::Mapping &ymap = map.value();
	for(const auto &kv: ymap.map()) {
		const std::string &var = kv.first;
		auto sequence = kv.second.getSequence();
		if (!sequence) {
			MSG("Error parsing %s: %s", var.c_str(), sequence.error().c_str());
			return;
		}

		Variable variable = {0, {}};

		const yaml::Sequence &yseq = sequence.value();
		for (const auto &it: yseq) {
			auto row = it.getSequence();
			if (!row) {
				MSG("Error parsing %s row: %s", var.c_str(), row.error().c_str());
				return;
			}

			const yaml::Sequence &yrow = row.value();
			if (yrow.size() < 2) {
				MSG("Error parsing %s row: should be at least [t, x]", var.c_str());
				return;
			}

#define READ_FLOAT(i, name, to) \
			do { \
				auto float_string = yrow[i].getString(); \
				if (!float_string) { \
					MSG("Error parsing %s row " #name ": %s", var.c_str(), float_string.error().c_str()); \
					return; \
				} \
				auto parsed_float = floatFromString(float_string.value()); \
				if (!parsed_float) { \
					MSG("Error parsing %s row " #name ": %s", var.c_str(), parsed_float.error().c_str()); \
					return; \
				} \
				to = parsed_float.value(); \
			} while(0)

			if (yrow.size() > 5) {
				MSG("Error parsing %s row: too many components %d, max 4", var.c_str(), static_cast<int>(yrow.size()));
				return;
			}

			const int yrow_components = static_cast<int>(yrow.size() - 1);
			if (variable.components == 0) {
				variable.components = yrow_components;
			} else if (variable.components != yrow_components) {
				MSG("Error parsing %s row: inconsistent number of components %d, %d expected",
					var.c_str(), yrow_components, variable.components);
				return;
			}

			Keypoint kp = {0,{0,0,0,0}};
			READ_FLOAT(0, time, kp.row);
			READ_FLOAT(1, x, kp.value.x);
			if (yrow.size() > 2) READ_FLOAT(2, y, kp.value.y);
			if (yrow.size() > 3) READ_FLOAT(3, z, kp.value.z);
			if (yrow.size() > 4) READ_FLOAT(4, w, kp.value.w);

			if (!variable.sequence.empty() && variable.sequence.back().row > kp.row) {
				MSG("Error parsing %s rows: monotonic time expected", var.c_str());
				return;
			}

			variable.sequence.push_back(kp);
		}

		if (!variable.sequence.empty())
			new_data.emplace(std::move(var), std::move(variable));
	}

	data_ = std::move(new_data);
}